

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::parseDeclarations(string_view *input,DeclarationList *declarations)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  bool bVar1;
  bool bVar2;
  size_type __n;
  const_reference pvVar3;
  string_view sVar4;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  string_view local_98;
  undefined1 local_88 [8];
  Declaration declaration;
  string_view value;
  undefined1 local_40 [8];
  string name;
  DeclarationList *declarations_local;
  string_view *input_local;
  
  name.field_2._8_8_ = declarations;
  bVar1 = skipDelimiter(input,'{');
  if (bVar1) {
    skipOptionalSpaces(input);
    do {
      std::__cxx11::string::string((string *)local_40);
      bVar1 = readCSSIdentifier(input,(string *)local_40);
      if (bVar1) {
        skipOptionalSpaces(input);
        bVar1 = skipDelimiter(input,':');
        if (bVar1) {
          skipOptionalSpaces(input);
          declaration.value.field_2._8_8_ = input->_M_len;
          while( true ) {
            bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
            bVar1 = false;
            if (!bVar2) {
              pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
              bVar1 = true;
              if (*pvVar3 != '!') {
                pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
                bVar1 = true;
                if (*pvVar3 != ';') {
                  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
                  bVar1 = *pvVar3 == '}';
                }
              }
              bVar1 = (bool)(bVar1 ^ 1);
            }
            if (!bVar1) break;
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
          }
          __n = std::basic_string_view<char,_std::char_traits<char>_>::length(input);
          this = (basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&declaration.value.field_2 + 8);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix(this,__n);
          stripTrailingSpaces(this);
          Declaration::Declaration((Declaration *)local_88);
          local_88._0_4_ = 0x10;
          sVar4 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
          local_98 = sVar4;
          local_88[4] = csspropertyid(&local_98);
          std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)&declaration,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&declaration.value.field_2 + 8));
          bVar1 = skipDelimiter(input,'!');
          if (bVar1) {
            skipOptionalSpaces(input);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_a8,"important");
            bVar1 = skipString(input,&local_a8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_88._0_4_ = 0x1000;
              goto LAB_0013d30b;
            }
            input_local._7_1_ = 0;
            bVar1 = true;
          }
          else {
LAB_0013d30b:
            if (local_88[4] != Unknown) {
              std::vector<lunasvg::Declaration,_std::allocator<lunasvg::Declaration>_>::push_back
                        ((vector<lunasvg::Declaration,_std::allocator<lunasvg::Declaration>_> *)
                         name.field_2._8_8_,(value_type *)local_88);
            }
            skipOptionalSpacesOrDelimiter(input,';');
            bVar1 = false;
          }
          Declaration::~Declaration((Declaration *)local_88);
        }
        else {
          input_local._7_1_ = 0;
          bVar1 = true;
        }
      }
      else {
        input_local._7_1_ = 0;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_40);
      if (bVar1) goto LAB_0013d3b4;
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
      bVar1 = false;
      if (!bVar2) {
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
        bVar1 = *pvVar3 != '}';
      }
    } while (bVar1);
    input_local._7_1_ = skipDelimiter(input,'}');
  }
  else {
    input_local._7_1_ = 0;
  }
LAB_0013d3b4:
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

static bool parseDeclarations(std::string_view& input, DeclarationList& declarations)
{
    if(!skipDelimiter(input, '{'))
        return false;
    skipOptionalSpaces(input);
    do {
        std::string name;
        if(!readCSSIdentifier(input, name))
            return false;
        skipOptionalSpaces(input);
        if(!skipDelimiter(input, ':'))
            return false;
        skipOptionalSpaces(input);
        std::string_view value(input);
        while(!input.empty() && !(input.front() == '!' || input.front() == ';' || input.front() == '}'))
            input.remove_prefix(1);
        value.remove_suffix(input.length());
        stripTrailingSpaces(value);

        Declaration declaration;
        declaration.specificity = 0x10;
        declaration.id = csspropertyid(name);
        declaration.value.assign(value);
        if(skipDelimiter(input, '!')) {
            skipOptionalSpaces(input);
            if(!skipString(input, "important"))
                return false;
            declaration.specificity = 0x1000;
        }

        if(declaration.id != PropertyID::Unknown)
            declarations.push_back(std::move(declaration));
        skipOptionalSpacesOrDelimiter(input, ';');
    } while(!input.empty() && input.front() != '}');
    return skipDelimiter(input, '}');
}